

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall ModbusSimulationDataGenerator::init_crc16_tab(ModbusSimulationDataGenerator *this)

{
  ushort local_1c;
  ushort local_1a;
  int local_18;
  U16 c;
  U16 crc;
  int j;
  int i;
  ModbusSimulationDataGenerator *this_local;
  
  for (_c = 0; _c < 0x100; _c = _c + 1) {
    local_1a = 0;
    local_1c = (ushort)_c;
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      if (((local_1a ^ local_1c) & 1) == 0) {
        local_1a = (ushort)((int)(uint)local_1a >> 1);
      }
      else {
        local_1a = (ushort)((int)(uint)local_1a >> 1) ^ 0xa001;
      }
      local_1c = (ushort)((int)(uint)local_1c >> 1);
    }
    this->crc_tab16[_c] = local_1a;
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::init_crc16_tab( void )
{
    int i, j;
    U16 crc, c;

    for( i = 0; i < 256; i++ )
    {
        crc = 0;
        c = ( U16 )i;

        for( j = 0; j < 8; j++ )
        {
            if( ( crc ^ c ) & 0x0001 )
                crc = ( crc >> 1 ) ^ 0xA001;
            else
                crc = crc >> 1;

            c = c >> 1;
        }

        crc_tab16[ i ] = crc;
    }
}